

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O3

RACell * __thiscall asmjit::RAPass::_newVarCell(RAPass *this,VirtReg *vreg)

{
  CodeBuilder *pCVar1;
  RACell *pRVar2;
  uint uVar3;
  VirtReg *unaff_RBX;
  RAPass *this_00;
  RAPass *unaff_R14;
  uint32_t unaff_R15D;
  
  if (vreg->_memCell == (RACell *)0x0) {
    unaff_R15D = vreg->_size;
    if ((vreg->field_0x17 & 2) != 0) {
      pRVar2 = _newStackCell(this,unaff_R15D,(uint)vreg->_alignment);
      if (pRVar2 == (RACell *)0x0) {
        return (RACell *)0x0;
      }
      goto LAB_001805de;
    }
    this_00 = (RAPass *)this->_zone;
    pCVar1 = (this_00->super_CBPass)._cb;
    pRVar2 = (RACell *)(this_00->super_CBPass)._vptr_CBPass;
    unaff_RBX = vreg;
    unaff_R14 = this;
    if ((ulong)((long)pCVar1 - (long)pRVar2) < 0x18) goto LAB_00180641;
    (this_00->super_CBPass)._vptr_CBPass = (_func_int **)(pRVar2 + 1);
    if (pCVar1 < (CodeBuilder *)(pRVar2 + 1)) {
      _newVarCell();
      goto switchD_001805bf_caseD_3;
    }
  }
  else {
    _newVarCell();
    this_00 = this;
LAB_00180641:
    pRVar2 = (RACell *)Zone::_alloc((Zone *)this_00,0x18);
    vreg = unaff_RBX;
  }
  if (pRVar2 == (RACell *)0x0) {
    _newVarCell(unaff_R14);
    return (RACell *)0x0;
  }
  pRVar2->next = unaff_R14->_memVarCells;
  pRVar2->offset = 0;
  pRVar2->size = unaff_R15D;
  pRVar2->alignment = unaff_R15D;
  unaff_R14->_memVarCells = pRVar2;
  uVar3 = unaff_R14->_memMaxAlign;
  if (unaff_R14->_memMaxAlign <= unaff_R15D) {
    uVar3 = unaff_R15D;
  }
  unaff_R14->_memMaxAlign = uVar3;
  unaff_R14->_memVarTotal = unaff_R14->_memVarTotal + unaff_R15D;
  if ((int)unaff_R15D < 0x10) {
    switch(unaff_R15D) {
    case 1:
      unaff_R14->_mem1ByteVarsUsed = unaff_R14->_mem1ByteVarsUsed + 1;
      break;
    case 2:
      unaff_R14->_mem2ByteVarsUsed = unaff_R14->_mem2ByteVarsUsed + 1;
      break;
    default:
switchD_001805bf_caseD_3:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/regalloc.cpp"
                 ,0xc5,"ASMJIT_NOT_REACHED has been reached");
    case 4:
      unaff_R14->_mem4ByteVarsUsed = unaff_R14->_mem4ByteVarsUsed + 1;
      break;
    case 8:
      unaff_R14->_mem8ByteVarsUsed = unaff_R14->_mem8ByteVarsUsed + 1;
    }
  }
  else if (unaff_R15D == 0x10) {
    unaff_R14->_mem16ByteVarsUsed = unaff_R14->_mem16ByteVarsUsed + 1;
  }
  else if (unaff_R15D == 0x20) {
    unaff_R14->_mem32ByteVarsUsed = unaff_R14->_mem32ByteVarsUsed + 1;
  }
  else {
    if (unaff_R15D != 0x40) goto switchD_001805bf_caseD_3;
    unaff_R14->_mem64ByteVarsUsed = unaff_R14->_mem64ByteVarsUsed + 1;
  }
LAB_001805de:
  vreg->_memCell = pRVar2;
  return pRVar2;
}

Assistant:

RACell* RAPass::_newVarCell(VirtReg* vreg) {
  ASMJIT_ASSERT(vreg->_memCell == nullptr);

  RACell* cell;
  uint32_t size = vreg->getSize();

  if (vreg->isStack()) {
    cell = _newStackCell(size, vreg->getAlignment());
    if (ASMJIT_UNLIKELY(!cell)) return nullptr;
  }
  else {
    cell = static_cast<RACell*>(_zone->alloc(sizeof(RACell)));
    if (!cell) goto _NoMemory;

    cell->next = _memVarCells;
    cell->offset = 0;
    cell->size = size;
    cell->alignment = size;

    _memVarCells = cell;
    _memMaxAlign = std::max<uint32_t>(_memMaxAlign, size);
    _memVarTotal += size;

    switch (size) {
      case  1: _mem1ByteVarsUsed++ ; break;
      case  2: _mem2ByteVarsUsed++ ; break;
      case  4: _mem4ByteVarsUsed++ ; break;
      case  8: _mem8ByteVarsUsed++ ; break;
      case 16: _mem16ByteVarsUsed++; break;
      case 32: _mem32ByteVarsUsed++; break;
      case 64: _mem64ByteVarsUsed++; break;

      default:
        ASMJIT_NOT_REACHED();
    }
  }

  vreg->_memCell = cell;
  return cell;

_NoMemory:
  cc()->setLastError(DebugUtils::errored(kErrorNoHeapMemory));
  return nullptr;
}